

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O3

bool slang::syntax::SyntaxFacts::isPossibleInstance(TokenKind kind)

{
  return (bool)((byte)(0x4020004 >> ((byte)kind & 0x1f)) & kind < DotStar);
}

Assistant:

bool SyntaxFacts::isPossibleInstance(TokenKind kind) {
    switch (kind) {
        case TokenKind::Identifier:
        case TokenKind::OpenParenthesis:
        case TokenKind::Comma:
            return true;
        default:
            return false;
    }
}